

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O1

void __thiscall
bandit::detail::bandit_context::register_before_each(bandit_context *this,voidfunc_t *func)

{
  size_t *psVar1;
  _Node *p_Var2;
  test_run_error *this_00;
  
  if (this->is_executing_ != true) {
    p_Var2 = std::__cxx11::list<std::function<void()>,std::allocator<std::function<void()>>>::
             _M_create_node<std::function<void()>const&>
                       ((list<std::function<void()>,std::allocator<std::function<void()>>> *)
                        &this->before_eaches_,func);
    std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
    psVar1 = &(this->before_eaches_).
              super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    return;
  }
  this_00 = (test_run_error *)__cxa_allocate_exception(0x10);
  test_run_error::test_run_error(this_00,"before_each was called after \'describe\' or \'it\'");
  __cxa_throw(this_00,&test_run_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void register_before_each(voidfunc_t func)
        {
          if(is_executing_)
          {
            throw test_run_error("before_each was called after 'describe' or 'it'");
          }

          before_eaches_.push_back(func);
        }